

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentialExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::ExponentialExpression::derivative
          (ExponentialExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> sStack_58;
  UnaryExpression local_48;
  Expression local_30;
  
  exp<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((ExponentialExpression *)&local_48,
             (shared_ptr<Kandinsky::BaseExpression> *)
             &(variable->
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&sStack_58);
  operator*<Kandinsky::ExponentialExpression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_30,(ExponentialExpression *)&local_48,&sStack_58);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_30);
  Expression::~Expression(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_58.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  UnaryExpression::~UnaryExpression(&local_48);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr ExponentialExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(exp(m_arg) * m_arg->derivative(variable));
    }